

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O1

VisitReturn __thiscall
QMakeEvaluator::visitProVariable
          (QMakeEvaluator *this,ushort tok,ProStringList *curr,ushort **tokPtr)

{
  int iVar1;
  ushort *puVar2;
  int *piVar3;
  Data *pDVar4;
  Data *pDVar5;
  bool bVar6;
  VisitReturn VVar7;
  CutResult CVar8;
  ProString *this_00;
  pointer pQVar9;
  qsizetype qVar10;
  QArrayDataPointer<ProString> *this_01;
  iterator this_02;
  ProStringList *pPVar11;
  char16_t *pcVar12;
  char *fmt;
  QArrayData *pQVar13;
  uint sizeHint;
  ProString *pPVar14;
  long in_FS_OFFSET;
  bool global;
  bool bVar15;
  bool bVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QStringView QVar19;
  QByteArrayView QVar20;
  QStringView QVar21;
  QRegularExpression regexp;
  ProString local_198;
  QString local_168;
  QArrayData *local_150;
  undefined8 *local_148;
  ProString local_138;
  QString local_100;
  QArrayData *local_e8;
  undefined8 *local_e0;
  undefined1 *local_d0;
  QString local_c8;
  QString local_a8;
  QArrayDataPointer<ProString> local_88;
  QArrayData *local_68;
  char16_t *pcStack_60;
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = *tokPtr;
  *tokPtr = puVar2 + 1;
  if ((curr->super_QList<ProString>).d.size == 1) {
    sizeHint = (uint)*puVar2;
    this_00 = &map(this,(ProKey *)(curr->super_QList<ProString>).d.ptr)->super_ProString;
    if (tok == 6) {
      local_58.d = (Data *)0x0;
      local_58.ptr = (ProString *)0x0;
      local_58.size = 0;
      VVar7 = expandVariableReferences(this,tokPtr,sizeHint,(ProStringList *)&local_58,true);
      if (VVar7 == ReturnError) {
        VVar7 = ReturnError;
        bVar6 = false;
      }
      else {
        local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        pcStack_60 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        pcVar12 = ((local_58.ptr)->m_string).d.ptr;
        local_138.m_string.d.d = (Data *)(long)(local_58.ptr)->m_offset;
        local_198.m_string.d.d = (Data *)(long)(local_58.ptr)->m_length;
        CVar8 = QtPrivate::QContainerImplHelper::mid
                          (((local_58.ptr)->m_string).d.size,(qsizetype *)&local_138,
                           (qsizetype *)&local_198);
        if (CVar8 == Null) {
          local_68 = (QArrayData *)0x0;
          pcStack_60 = (char16_t *)0x0;
        }
        else {
          pcStack_60 = pcVar12 + (long)local_138.m_string.d.d;
          local_68 = &(local_198.m_string.d.d)->super_QArrayData;
        }
        if (((long)local_68 < 4) || (*pcStack_60 != L's')) {
          QVar18.m_data = (storage_type *)0x32;
          QVar18.m_size = (qsizetype)&local_138;
          QString::fromLatin1(QVar18);
          message(this,0x310,&local_138.m_string);
          if (&(local_138.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_138.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          bVar6 = false;
        }
        else {
          local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_88.d._0_4_ = 0xaaaaaaaa;
          local_88.d._4_4_ = 0xaaaaaaaa;
          local_88.ptr._0_4_ = 0xaaaaaaaa;
          local_88.ptr._4_4_ = 0xaaaaaaaa;
          QStringView::split(&local_88,&local_68,pcStack_60[1],0,1);
          bVar6 = (undefined1 *)(local_88.size + -3) < (undefined1 *)0x2;
          if (bVar6) {
            if ((undefined1 *)local_88.size == (undefined1 *)0x4) {
              pQVar9 = QList<QStringView>::data((QList<QStringView> *)&local_88);
              qVar10 = QStringView::indexOf(pQVar9 + 3,(QChar)0x67,0,CaseSensitive);
              global = qVar10 != -1;
              pQVar9 = QList<QStringView>::data((QList<QStringView> *)&local_88);
              qVar10 = QStringView::indexOf(pQVar9 + 3,(QChar)0x69,0,CaseSensitive);
              bVar15 = qVar10 != -1;
              pQVar9 = QList<QStringView>::data((QList<QStringView> *)&local_88);
              qVar10 = QStringView::indexOf(pQVar9 + 3,(QChar)0x71,0,CaseSensitive);
              bVar16 = qVar10 != -1;
            }
            else {
              bVar15 = true;
              global = false;
              bVar16 = false;
            }
            local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar9 = QList<QStringView>::data((QList<QStringView> *)&local_88);
            QString::QString(&local_a8,(QChar *)pQVar9[1].m_data,pQVar9[1].m_size);
            local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_c8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar9 = QList<QStringView>::data((QList<QStringView> *)&local_88);
            QString::QString(&local_c8,(QChar *)pQVar9[2].m_data,pQVar9[2].m_size);
            if (bVar16) {
              QVar21.m_data = (storage_type_conflict *)local_a8.d.size;
              QVar21.m_size = (qsizetype)&local_138;
              QRegularExpression::escape(QVar21);
              pcVar12 = local_a8.d.ptr;
              pDVar5 = local_a8.d.d;
              qVar10 = local_138.m_string.d.size;
              pDVar4 = local_138.m_string.d.d;
              local_138.m_string.d.d = local_a8.d.d;
              local_a8.d.d = pDVar4;
              local_a8.d.ptr = local_138.m_string.d.ptr;
              local_138.m_string.d.ptr = pcVar12;
              local_138.m_string.d.size = local_a8.d.size;
              local_a8.d.size = qVar10;
              if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
                }
              }
            }
            local_d0 = &DAT_aaaaaaaaaaaaaaaa;
            QRegularExpression::QRegularExpression((QRegularExpression *)&local_d0,&local_a8,bVar15)
            ;
            pPVar11 = valuesRef(this,(ProKey *)this_00);
            replaceInList(pPVar11,(QRegularExpression *)&local_d0,&local_c8,global,&this->m_tmp2);
            if (this->m_debugLevel != 0) {
              ProString::ProString(&local_138,&local_a8);
              formatValue(&local_100,&local_138,true);
              QString::toLocal8Bit_helper((QChar *)&local_e8,(longlong)local_100.d.ptr);
              if (local_e0 == (undefined8 *)0x0) {
                local_e0 = &QByteArray::_empty;
              }
              ProString::ProString(&local_198,&local_c8);
              formatValue(&local_168,&local_198,true);
              QString::toLocal8Bit_helper((QChar *)&local_150,(longlong)local_168.d.ptr);
              if (local_148 == (undefined8 *)0x0) {
                local_148 = &QByteArray::_empty;
              }
              debugMsgInternal(this,2,"replaced %s with %s",local_e0,local_148);
              if (local_150 != (QArrayData *)0x0) {
                LOCK();
                (local_150->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_150->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_150->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_150,1,0x10);
                }
              }
              if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_198.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_198.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_198.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_198.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_198.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (local_e8 != (QArrayData *)0x0) {
                LOCK();
                (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_e8,1,0x10);
                }
              }
              if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_138.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_138.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            QRegularExpression::~QRegularExpression((QRegularExpression *)&local_d0);
            if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              iVar1 = ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              ;
              UNLOCK();
              pQVar13 = &(local_a8.d.d)->super_QArrayData;
joined_r0x0027b19c:
              if (iVar1 == 0) {
                QArrayData::deallocate(pQVar13,2,0x10);
              }
            }
          }
          else {
            QVar20.m_data = (storage_type *)0x2b;
            QVar20.m_size = (qsizetype)&local_138;
            QString::fromLatin1(QVar20);
            message(this,0x310,&local_138.m_string);
            if (&(local_138.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              iVar1 = ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i;
              UNLOCK();
              pQVar13 = &(local_138.m_string.d.d)->super_QArrayData;
              goto joined_r0x0027b19c;
            }
          }
          piVar3 = (int *)CONCAT44(local_88.d._4_4_,local_88.d._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_88.d._4_4_,local_88.d._0_4_),0x10,0x10);
            }
          }
        }
        VVar7 = ReturnTrue;
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
      if (!bVar6) goto LAB_0027af81;
    }
    else {
      local_138.m_string.d.d = (Data *)0x0;
      local_138.m_string.d.ptr = (char16_t *)0x0;
      local_138.m_string.d.size = 0;
      VVar7 = expandVariableReferences(this,tokPtr,sizeHint,(ProStringList *)&local_138,false);
      if (VVar7 == ReturnError) {
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_138)
        ;
        VVar7 = ReturnError;
        goto LAB_0027af81;
      }
      if (tok == 3) {
        ProStringList::removeEmpty((ProStringList *)&local_138);
        pPVar11 = valuesRef(this,(ProKey *)this_00);
        QtPrivate::QCommonArrayOps<ProString>::growAppend
                  ((QCommonArrayOps<ProString> *)pPVar11,(ProString *)local_138.m_string.d.ptr,
                   (ProString *)((long)local_138.m_string.d.ptr + local_138.m_string.d.size * 0x30))
        ;
        if (this->m_debugLevel != 0) {
          fmt = "appending";
          goto LAB_0027ade1;
        }
      }
      else if (tok == 4) {
        pPVar11 = valuesRef(this,(ProKey *)this_00);
        ProStringList::insertUnique(pPVar11,(ProStringList *)&local_138);
        if (this->m_debugLevel != 0) {
          fmt = "appending unique";
          goto LAB_0027ade1;
        }
      }
      else if (tok == 5) {
        pPVar11 = valuesRef(this,(ProKey *)this_00);
        ProStringList::removeEach(pPVar11,(ProStringList *)&local_138);
        if (this->m_debugLevel != 0) {
          fmt = "removing";
LAB_0027ade1:
          debugMsgInternal(this,2,fmt);
        }
      }
      else {
        ProStringList::removeEmpty((ProStringList *)&local_138);
        this_01 = (QArrayDataPointer<ProString> *)
                  QMap<ProKey,_ProStringList>::operator[]
                            ((QMap<ProKey,_ProStringList> *)
                             ((this->m_valuemapStack).
                              super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                              .
                              super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                              ._M_impl._M_node.super__List_node_base._M_prev + 1),(ProKey *)this_00)
        ;
        QArrayDataPointer<ProString>::operator=(this_01,(QArrayDataPointer<ProString> *)&local_138);
        if (this->m_debugLevel != 0) {
          fmt = "assigning";
          goto LAB_0027ade1;
        }
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_138);
    }
    if (this->m_debugLevel != 0) {
      local_138.m_string.d.d = (Data *)(long)this_00->m_offset;
      local_198.m_string.d.d = (Data *)(long)this_00->m_length;
      CVar8 = QtPrivate::QContainerImplHelper::mid
                        ((this_00->m_string).d.size,(qsizetype *)&local_138,(qsizetype *)&local_198)
      ;
      pQVar13 = &(local_198.m_string.d.d)->super_QArrayData;
      if (CVar8 == Null) {
        pQVar13 = (QArrayData *)0x0;
      }
      QVar19.m_data = (storage_type_conflict *)pQVar13;
      QVar19.m_size = (qsizetype)&local_138;
      QtPrivate::convertToLocal8Bit(QVar19);
      pPVar14 = (ProString *)local_138.m_string.d.ptr;
      if ((ProString *)local_138.m_string.d.ptr == (ProString *)0x0) {
        pPVar14 = (ProString *)&QByteArray::_empty;
      }
      values((ProStringList *)&local_88,this,(ProKey *)this_00);
      formatValueList((QString *)&local_58,(ProStringList *)&local_88,false);
      QString::toLocal8Bit_helper((QChar *)&local_198,(longlong)local_58.ptr);
      pcVar12 = local_198.m_string.d.ptr;
      if (local_198.m_string.d.ptr == (char16_t *)0x0) {
        pcVar12 = (char16_t *)&QByteArray::_empty;
      }
      traceMsgInternal(this,"%s := %s",pPVar14,pcVar12);
      if (&(local_198.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_198.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_198.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_198.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_198.m_string.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
        }
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_88);
      if (&(local_138.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_138.m_string.d.d)->super_QArrayData,1,0x10);
        }
      }
    }
    bVar6 = ProString::operator==(this_00,(ProString *)(QMakeInternal::statics + 0x150));
    if (bVar6) {
      setTemplate(this);
    }
    else {
      bVar6 = ProString::operator==(this_00,(ProString *)(QMakeInternal::statics + 0x180));
      if (!bVar6) {
        bVar6 = ProString::operator==(this_00,(ProString *)(QMakeInternal::statics + 0x1b0));
        if (!bVar6) {
          bVar6 = ProString::operator==(this_00,(ProString *)(QMakeInternal::statics + 0x1e0));
          if (bVar6) {
            values((ProStringList *)&local_138,this,(ProKey *)this_00);
            qVar10 = local_138.m_string.d.size;
            QArrayDataPointer<ProString>::~QArrayDataPointer
                      ((QArrayDataPointer<ProString> *)&local_138);
            VVar7 = ReturnTrue;
            if ((storage_type_conflict *)qVar10 != (storage_type_conflict *)0x0) {
              local_138.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_138.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_138.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              values((ProStringList *)&local_198,this,(ProKey *)this_00);
              this_02 = QList<ProString>::begin(&local_198);
              ProString::toQString(&local_138.m_string,this_02.i);
              QArrayDataPointer<ProString>::~QArrayDataPointer
                        ((QArrayDataPointer<ProString> *)&local_198);
              bVar6 = QMakeInternal::IoUtils::isRelativePath(&local_138.m_string);
              if (!bVar6) {
                QString::operator=(&this->m_qmakespec,(QString *)&local_138);
                QVar21 = QMakeInternal::IoUtils::fileName(&this->m_qmakespec);
                QString::QString(&local_198.m_string,(QChar *)QVar21.m_data,QVar21.m_size);
                pQVar13 = &((this->m_qmakespecName).d.d)->super_QArrayData;
                pcVar12 = (this->m_qmakespecName).d.ptr;
                (this->m_qmakespecName).d.d = local_198.m_string.d.d;
                (this->m_qmakespecName).d.ptr = local_198.m_string.d.ptr;
                qVar10 = (this->m_qmakespecName).d.size;
                (this->m_qmakespecName).d.size = local_198.m_string.d.size;
                local_198.m_string.d.d = (Data *)pQVar13;
                local_198.m_string.d.ptr = pcVar12;
                local_198.m_string.d.size = qVar10;
                if (pQVar13 != (QArrayData *)0x0) {
                  LOCK();
                  (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
                       (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(pQVar13,2,0x10);
                  }
                }
                QExplicitlySharedDataPointer<QMakeFeatureRoots>::reset
                          (&this->m_featureRoots,(QMakeFeatureRoots *)0x0);
              }
              if (&(local_138.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_138.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
          }
          else {
            bVar6 = ProString::operator==(this_00,(ProString *)(QMakeInternal::statics + 0x210));
            VVar7 = ReturnTrue;
            if (bVar6) {
              values((ProStringList *)&local_138,this,(ProKey *)this_00);
              VVar7 = checkRequirements(this,(ProStringList *)&local_138);
              QArrayDataPointer<ProString>::~QArrayDataPointer
                        ((QArrayDataPointer<ProString> *)&local_138);
            }
          }
          goto LAB_0027af81;
        }
        first(&local_138,this,(ProKey *)this_00);
        QString::operator=(&(this->m_dirSep).m_string,(QString *)&local_138);
        (this->m_dirSep).m_hash = local_138.m_hash;
        (this->m_dirSep).m_offset = local_138.m_offset;
        (this->m_dirSep).m_length = local_138.m_length;
        (this->m_dirSep).m_file = local_138.m_file;
        *(undefined4 *)&(this->m_dirSep).field_0x24 = local_138._36_4_;
        goto LAB_0027aac1;
      }
      QExplicitlySharedDataPointer<QMakeFeatureRoots>::reset
                (&this->m_featureRoots,(QMakeFeatureRoots *)0x0);
    }
  }
  else {
    skipExpression(this,tokPtr);
    QVar17.m_data = (storage_type *)0x3d;
    QVar17.m_size = (qsizetype)&local_138;
    QString::fromLatin1(QVar17);
    message(this,0x310,&local_138.m_string);
LAB_0027aac1:
    if (&(local_138.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_138.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  VVar7 = ReturnTrue;
LAB_0027af81:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return VVar7;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::visitProVariable(
        ushort tok, const ProStringList &curr, const ushort *&tokPtr)
{
    int sizeHint = *tokPtr++;

    if (curr.size() != 1) {
        skipExpression(tokPtr);
        if (!m_cumulative || !curr.isEmpty())
            evalError(fL1S("Left hand side of assignment must expand to exactly one word."));
        return ReturnTrue;
    }
    const ProKey &varName = map(curr.first());

    if (tok == TokReplace) {      // ~=
        // DEFINES ~= s/a/b/?[gqi]

        ProStringList varVal;
        if (expandVariableReferences(tokPtr, sizeHint, &varVal, true) == ReturnError)
            return ReturnError;
        QStringView val = varVal.at(0).toQStringView();
        if (val.size() < 4 || val.at(0) != QLatin1Char('s')) {
            evalError(fL1S("The ~= operator can handle only the s/// function."));
            return ReturnTrue;
        }
        QChar sep = val.at(1);
        auto func = val.split(sep, Qt::KeepEmptyParts);
        if (func.size() < 3 || func.size() > 4) {
            evalError(fL1S("The s/// function expects 3 or 4 arguments."));
            return ReturnTrue;
        }

        bool global = false, quote = false, case_sense = false;
        if (func.size() == 4) {
            global = func[3].indexOf(QLatin1Char('g')) != -1;
            case_sense = func[3].indexOf(QLatin1Char('i')) == -1;
            quote = func[3].indexOf(QLatin1Char('q')) != -1;
        }
        QString pattern = func[1].toString();
        QString replace = func[2].toString();
        if (quote)
            pattern = QRegularExpression::escape(pattern);

        QRegularExpression regexp(pattern, case_sense ? QRegularExpression::NoPatternOption :
                                                        QRegularExpression::CaseInsensitiveOption);

        // We could make a union of modified and unmodified values,
        // but this will break just as much as it fixes, so leave it as is.
        replaceInList(&valuesRef(varName), regexp, replace, global, m_tmp2);
        debugMsg(2, "replaced %s with %s", dbgQStr(pattern), dbgQStr(replace));
    } else {
        ProStringList varVal;
        if (expandVariableReferences(tokPtr, sizeHint, &varVal, false) == ReturnError)
            return ReturnError;
        switch (tok) {
        default: // whatever - cannot happen
        case TokAssign:          // =
            varVal.removeEmpty();
            // FIXME: add check+warning about accidental value removal.
            // This may be a bit too noisy, though.
            m_valuemapStack.top()[varName] = varVal;
            debugMsg(2, "assigning");
            break;
        case TokAppendUnique:    // *=
            valuesRef(varName).insertUnique(varVal);
            debugMsg(2, "appending unique");
            break;
        case TokAppend:          // +=
            varVal.removeEmpty();
            valuesRef(varName) += varVal;
            debugMsg(2, "appending");
            break;
        case TokRemove:       // -=
            if (!m_cumulative) {
                valuesRef(varName).removeEach(varVal);
            } else {
                // We are stingy with our values.
            }
            debugMsg(2, "removing");
            break;
        }
    }
    traceMsg("%s := %s", dbgKey(varName), dbgStrList(values(varName)));

    if (varName == statics.strTEMPLATE)
        setTemplate();
    else if (varName == statics.strQMAKE_PLATFORM)
        m_featureRoots = nullptr;
    else if (varName == statics.strQMAKE_DIR_SEP)
        m_dirSep = first(varName);
    else if (varName == statics.strQMAKESPEC) {
        if (!values(varName).isEmpty()) {
            QString spec = values(varName).first().toQString();
            if (IoUtils::isAbsolutePath(spec)) {
                m_qmakespec = spec;
                m_qmakespecName = IoUtils::fileName(m_qmakespec).toString();
                m_featureRoots = nullptr;
            }
        }
    }
#ifdef PROEVALUATOR_FULL
    else if (varName == statics.strREQUIRES)
        return checkRequirements(values(varName));
#endif

    return ReturnTrue;
}